

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

int xmlConvertUriToPath(char *uri,char **out)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  
  *out = (char *)0x0;
  iVar1 = xmlStrncasecmp((xmlChar *)uri,(xmlChar *)"file://localhost/",0x11);
  if (iVar1 == 0) {
    lVar2 = 0x10;
  }
  else {
    iVar1 = xmlStrncasecmp((xmlChar *)uri,(xmlChar *)"file:///",8);
    if (iVar1 == 0) {
      lVar2 = 7;
    }
    else {
      iVar1 = xmlStrncasecmp((xmlChar *)uri,(xmlChar *)"file:/",6);
      if (iVar1 != 0) {
        return 1;
      }
      lVar2 = 5;
    }
  }
  iVar1 = 0;
  pcVar3 = xmlURIUnescapeString(uri + lVar2,0,(char *)0x0);
  if (pcVar3 == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    *out = pcVar3;
  }
  return iVar1;
}

Assistant:

static int
xmlConvertUriToPath(const char *uri, char **out) {
    const char *escaped;
    char *unescaped;

    *out = NULL;

    if (!xmlStrncasecmp(BAD_CAST uri, BAD_CAST "file://localhost/", 17)) {
	escaped = &uri[16];
    } else if (!xmlStrncasecmp(BAD_CAST uri, BAD_CAST "file:///", 8)) {
	escaped = &uri[7];
    } else if (!xmlStrncasecmp(BAD_CAST uri, BAD_CAST "file:/", 6)) {
        /* lots of generators seems to lazy to read RFC 1738 */
	escaped = &uri[5];
    } else {
        return(1);
    }

#ifdef _WIN32
    /* Ignore slash like in file:///C:/file.txt */
    escaped += 1;
#endif

    unescaped = xmlURIUnescapeString(escaped, 0, NULL);
    if (unescaped == NULL)
        return(-1);

    *out = unescaped;
    return(0);
}